

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# morph_vertex_list.c
# Opt level: O2

bool_t prf_morph_vertex_list_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *puVar1;
  ulong uVar2;
  bool_t bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (node->opcode == prf_morph_vertex_list_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    puVar1 = node->data;
    uVar2 = (long)(int)(node->length - 4) / 4;
    uVar4 = 0;
    uVar5 = uVar2 & 0xffffffff;
    if ((int)uVar2 < 1) {
      uVar5 = uVar4;
    }
    bVar3 = 1;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      bf_put_uint32_be(bfile,*(uint32_t *)(puVar1 + uVar4 * 4));
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried morph vertex list save method on node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_morph_vertex_list_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint32_t * ptr;
    int num, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_morph_vertex_list_info.opcode ) {
        prf_error( 9, "tried morph vertex list save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        bf_put_uint32_be( bfile, ptr[num] );
        num++;
    }

    return TRUE;
}